

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collection.cpp
# Opt level: O1

bool mpt::add_items(metatype *to,node *head,relation *relation,logger *out)

{
  relation from;
  bool bVar1;
  byte bVar2;
  int iVar3;
  collection *pcVar4;
  undefined4 extraout_var;
  node *name;
  char *pcVar5;
  node *pnVar6;
  convertable *pcVar7;
  undefined4 extraout_var_01;
  collection *pcVar8;
  convertable *pcVar9;
  char *pcVar10;
  reference<mpt::metatype> m;
  relation *prVar11;
  object *ptr;
  size_t len;
  char _func [15];
  char *pos;
  identifier id;
  relation local_b8;
  uint local_98;
  undefined4 uStack_94;
  char local_90 [16];
  relation *local_80;
  collection **local_78;
  undefined8 local_70;
  convertable *local_68;
  collection **local_60;
  node *local_58;
  identifier *local_50;
  char *local_48;
  identifier local_40;
  undefined4 extraout_var_00;
  
  builtin_strncpy(local_90,"mpt::add_items",0xf);
  local_80 = relation;
  pcVar4 = &convertable::operator_cast_to_group_(&to->super_convertable)->super_collection;
  local_b8.super_relation._vptr_relation = (_func_int **)0x0;
  iVar3 = (**(to->super_convertable)._vptr_convertable)(to,0x84);
  local_78 = (collection **)0x0;
  if (-1 < iVar3) {
    local_78 = (collection **)local_b8.super_relation._vptr_relation;
  }
  if ((head != (node *)0x0) && (pcVar4 != (collection *)0x0 || local_78 != (collection **)0x0)) {
    local_60 = (collection **)&PTR_find_0014a058;
    do {
      pcVar7 = &head->_meta->super_convertable;
      if ((pcVar7 != (convertable *)0x0 && pcVar4 != (collection *)0x0) &&
         (iVar3 = (*pcVar7->_vptr_convertable[2])(pcVar7), CONCAT44(extraout_var,iVar3) != 0)) {
        iVar3 = (*((collection *)&pcVar4->_vptr_collection)->_vptr_collection[2])
                          (pcVar4,&head->ident,pcVar7);
        pcVar9 = pcVar7;
        if (iVar3 < 0) {
          pcVar9 = (convertable *)0x0;
        }
        if (iVar3 >= 0 && out != (logger *)0x0) {
          logger::message(out,local_90,4,"%s %p: %s","group",pcVar4,"failed to add object");
          pcVar9 = pcVar7;
        }
        bVar2 = 0;
        if (pcVar9 != (convertable *)0x0) {
          (*pcVar9->_vptr_convertable[1])();
        }
        goto LAB_0012be12;
      }
      name = (node *)mpt_node_ident(head);
      if (name == (node *)0x0) {
        bVar2 = 1;
        if (out == (logger *)0x0) goto LAB_0012be12;
        iVar3 = 3;
        pcVar5 = "%s %p: %s";
        pcVar10 = "node";
        name = head;
LAB_0012bc25:
        logger::message(out,local_90,iVar3,pcVar5,pcVar10,name);
        goto LAB_0012be12;
      }
      if (local_78 == (collection **)0x0) {
LAB_0012bbd4:
        if (pcVar4 == (collection *)0x0) goto LAB_0012be0c;
        local_58 = name;
        pnVar6 = (node *)mpt_convert_key(&local_58,0,&local_98);
        if ((pnVar6 != name) || (*(char *)&pnVar6->_meta == '\0')) {
          if (out != (logger *)0x0) {
            bVar2 = 0;
            iVar3 = 4;
            pcVar5 = "%s: %s";
            pcVar10 = "bad element name";
            goto LAB_0012bc25;
          }
          goto LAB_0012be0c;
        }
        iVar3 = (*((collection *)&pcVar4->_vptr_collection)->_vptr_collection[3])
                          (pcVar4,pnVar6,(ulong)local_98);
        pcVar7 = (convertable *)CONCAT44(extraout_var_00,iVar3);
        if (pcVar7 != (convertable *)0x0) {
          pcVar5 = (char *)mpt_convert_key(&local_58,":",&local_98);
          if ((pcVar5 == (char *)0x0) || (CONCAT44(uStack_94,local_98) == 0)) {
            if (out != (logger *)0x0) {
              logger::message(out,local_90,4,"%s","empty item name");
            }
          }
          else {
            local_b8.super_relation._vptr_relation = (_func_int **)local_60;
            local_b8._parent = (relation *)0x0;
            local_b8._sep = '.';
            local_b8._curr = pcVar4;
            iVar3 = (**pcVar7->_vptr_convertable)(pcVar7,0,0);
            prVar11 = local_80;
            pcVar9 = collection::relation::find(&local_b8,(long)iVar3,pcVar5,local_98);
            if (pcVar9 == (convertable *)0x0) {
              local_70 = CONCAT44(uStack_94,local_98);
              local_50 = &head->ident;
              local_68 = pcVar7;
              local_48 = pcVar5;
              do {
                pcVar5 = (char *)mpt_convert_key(&local_58,0,&local_98);
                pcVar7 = local_68;
                if (pcVar5 == (char *)0x0) {
                  identifier::identifier(&local_40,0x10);
                  pcVar5 = local_48;
                  bVar1 = identifier::set_name(&local_40,local_48,(int)local_70);
                  pcVar7 = local_68;
                  if (bVar1) {
                    iVar3 = (*((collection *)&pcVar4->_vptr_collection)->_vptr_collection[2])
                                      (pcVar4,&local_40,local_68);
                    if (iVar3 < 0) {
                      (*pcVar7->_vptr_convertable[1])(pcVar7);
                      bVar2 = 0;
                      if (out != (logger *)0x0) {
                        local_b8.super_relation._vptr_relation = (_func_int **)&local_b8._curr;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_b8,pcVar5,pcVar5 + (int)local_70);
                        logger::message(out,local_90,3,"%s: %s","unable add item",
                                        local_b8.super_relation._vptr_relation);
                        goto LAB_0012c26e;
                      }
                    }
                    else if (head->children == (node *)0x0) {
                      bVar2 = 0;
                    }
                    else {
                      local_b8.super_relation._vptr_relation = (_func_int **)0x0;
                      iVar3 = (**pcVar7->_vptr_convertable)(pcVar7,0x84,&local_b8);
                      if ((out != (logger *)0x0) &&
                         (iVar3 < 0 ||
                          (collection **)local_b8.super_relation._vptr_relation ==
                          (collection **)0x0)) {
                        logger::message(out,local_90,4,"%s (%p): %s",0,pcVar7,
                                        "element not an object");
                      }
                      if ((prVar11 == (relation *)0x0) ||
                         (pcVar8 = &convertable::operator_cast_to_group_(pcVar7)->super_collection,
                         pcVar8 == (collection *)0x0)) {
                        bVar1 = add_items((metatype *)pcVar7,head->children,(relation *)0x0,out);
                        bVar2 = bVar1 * '\x03' + 1;
                      }
                      else {
                        local_b8.super_relation._vptr_relation = (_func_int **)local_60;
                        local_b8._sep = '.';
                        local_b8._parent = prVar11;
                        local_b8._curr = pcVar8;
                        bVar1 = add_items((metatype *)pcVar7,head->children,&local_b8.super_relation
                                          ,out);
                        bVar2 = !bVar1;
                      }
                    }
                  }
                  else {
                    bVar2 = 0;
                    if (out != (logger *)0x0) {
                      local_b8.super_relation._vptr_relation = (_func_int **)&local_b8._curr;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_b8,pcVar5,pcVar5 + (int)local_70);
                      logger::message(out,local_90,3,"%s: %s","unable add item",
                                      local_b8.super_relation._vptr_relation);
LAB_0012c26e:
                      bVar2 = 0;
                      if ((collection **)local_b8.super_relation._vptr_relation != &local_b8._curr)
                      {
                        operator_delete(local_b8.super_relation._vptr_relation,
                                        (ulong)((long)&((collection *)
                                                       &(local_b8._curr)->_vptr_collection)->
                                                       _vptr_collection + 1));
                      }
                    }
                  }
                  identifier::set_name(&local_40,(char *)0x0,0);
                  break;
                }
                if (prVar11 == (relation *)0x0) {
                  local_b8.super_relation._vptr_relation = (_func_int **)local_60;
                  local_b8._parent = (relation *)0x0;
                  local_b8._sep = '.';
                  local_b8._curr = pcVar4;
                  iVar3 = (**local_68->_vptr_convertable)(local_68,0,0);
                  pcVar9 = collection::relation::find(&local_b8,(long)iVar3,pcVar5,local_98);
                }
                else {
                  iVar3 = (**local_68->_vptr_convertable)(local_68,0,0);
                  iVar3 = (**prVar11->_vptr_relation)(prVar11,(long)iVar3,pcVar5,(ulong)local_98);
                  pcVar9 = (convertable *)CONCAT44(extraout_var_01,iVar3);
                }
                if (pcVar9 == (convertable *)0x0) {
                  if (out != (logger *)0x0) {
                    pcVar10 = identifier::name(local_50);
                    local_b8.super_relation._vptr_relation = (_func_int **)&local_b8._curr;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_b8,pcVar5,pcVar5 + CONCAT44(uStack_94,local_98));
                    logger::message(out,local_90,3,"%s: \'%s\': %s","unable to get parent",pcVar10,
                                    local_b8.super_relation._vptr_relation);
                    prVar11 = local_80;
                    if ((collection **)local_b8.super_relation._vptr_relation != &local_b8._curr) {
                      operator_delete(local_b8.super_relation._vptr_relation,
                                      (ulong)((long)&((collection *)
                                                     &(local_b8._curr)->_vptr_collection)->
                                                     _vptr_collection + 1));
                    }
                  }
                  (*pcVar7->_vptr_convertable[1])(pcVar7);
LAB_0012c072:
                  bVar2 = 1;
                  bVar1 = false;
                }
                else {
                  local_b8.super_relation._vptr_relation = (_func_int **)0x0;
                  iVar3 = (**pcVar9->_vptr_convertable)(pcVar9,0x84,&local_b8);
                  from._vptr_relation = local_b8.super_relation._vptr_relation;
                  if ((collection **)local_b8.super_relation._vptr_relation == (collection **)0x0 ||
                      iVar3 < 0) {
LAB_0012bf45:
                    (*pcVar7->_vptr_convertable[1])(pcVar7);
                    bVar2 = 1;
                    if (out != (logger *)0x0) {
                      pcVar10 = identifier::name(local_50);
                      local_b8.super_relation._vptr_relation = (_func_int **)&local_b8._curr;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_b8,pcVar5,pcVar5 + CONCAT44(uStack_94,local_98));
                      logger::message(out,local_90,3,"%s: \'%s\': %s","unable to get inheritance",
                                      pcVar10,local_b8.super_relation._vptr_relation);
                      prVar11 = local_80;
                      if ((collection **)local_b8.super_relation._vptr_relation != &local_b8._curr)
                      {
                        operator_delete(local_b8.super_relation._vptr_relation,
                                        (ulong)((long)&((collection *)
                                                       &(local_b8._curr)->_vptr_collection)->
                                                       _vptr_collection + 1));
                      }
                      goto LAB_0012c072;
                    }
                    bVar1 = false;
                    prVar11 = local_80;
                  }
                  else {
                    local_b8.super_relation._vptr_relation = (_func_int **)0x0;
                    iVar3 = (**pcVar7->_vptr_convertable)(pcVar7,0x84,&local_b8);
                    if ((collection **)local_b8.super_relation._vptr_relation == (collection **)0x0
                        || iVar3 < 0) goto LAB_0012bf45;
                    object::set((object *)local_b8.super_relation._vptr_relation,
                                (object *)from._vptr_relation,out);
                    bVar2 = 5;
                    bVar1 = true;
                    prVar11 = local_80;
                  }
                }
              } while (bVar1);
              goto LAB_0012be12;
            }
            if (out != (logger *)0x0) {
              local_b8.super_relation._vptr_relation = (_func_int **)&local_b8._curr;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_b8,pcVar5,pcVar5 + CONCAT44(uStack_94,local_98));
              logger::message(out,local_90,4,"%s: %s","conflicting item name",
                              local_b8.super_relation._vptr_relation);
              if ((collection **)local_b8.super_relation._vptr_relation != &local_b8._curr) {
                operator_delete(local_b8.super_relation._vptr_relation,
                                (ulong)((long)&((collection *)&(local_b8._curr)->_vptr_collection)->
                                               _vptr_collection + 1));
              }
            }
          }
          (*pcVar7->_vptr_convertable[1])(pcVar7);
          goto LAB_0012be0c;
        }
        bVar2 = 0;
        if (out != (logger *)0x0) {
          local_b8.super_relation._vptr_relation = (_func_int **)&local_b8._curr;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,pnVar6,
                     (pnVar6->ident)._val + CONCAT44(uStack_94,local_98) + -0x2c);
          logger::message(out,local_90,4,"%s: %s","invalid item type",
                          local_b8.super_relation._vptr_relation);
          if ((collection **)local_b8.super_relation._vptr_relation != &local_b8._curr) {
            operator_delete(local_b8.super_relation._vptr_relation,
                            (ulong)((long)&((collection *)&(local_b8._curr)->_vptr_collection)->
                                           _vptr_collection + 1));
          }
        }
      }
      else {
        if (pcVar4 == (collection *)0x0) {
          iVar3 = (*(code *)(*local_78)[1]._vptr_collection)(local_78,name,pcVar7);
          bVar2 = 0;
          if (-1 < iVar3) goto LAB_0012be12;
        }
        if (pcVar7 == (convertable *)0x0) goto LAB_0012bbd4;
        local_b8.super_relation._vptr_relation = (_func_int **)0x0;
        local_b8._parent = (relation *)0x0;
        iVar3 = (**pcVar7->_vptr_convertable)(pcVar7,0x19,&local_b8);
        if ((iVar3 < 0) ||
           (bVar1 = object::set((object *)local_78,(char *)name,(value *)&local_b8,out), !bVar1)) {
          pcVar5 = convertable::string(pcVar7);
          object::set((object *)local_78,(char *)name,pcVar5,out);
        }
LAB_0012be0c:
        bVar2 = 0;
      }
LAB_0012be12:
      if ((bVar2 & 3) != 0) {
        return false;
      }
      head = head->next;
    } while (head != (node *)0x0);
  }
  return true;
}

Assistant:

bool add_items(metatype &to, const node *head, const relation *relation, logger *out)
{
	const char _func[] = "mpt::add_items";
	group *grp = to;
	object *obj = to;
	
	// no assignable target
	if (!grp && !obj) {
		return true;
	}
	
	for (; head; head = head->next) {
		metatype *from = head->_meta;
		
		if (grp && from && from->addref()) {
			reference<metatype> m;
			m.set_instance(from);
			if (grp->append(&head->ident, from) < 0) {
				m.detach();
			}
			else if (out) {
				out->message(_func, out->Warning, "%s %p: %s",
				             MPT_tr("group"), grp, MPT_tr("failed to add object"));
			}
			continue;
		}
		// name is property
		const char *name;
		
		if (!(name = mpt_node_ident(head))) {
			if (out) {
				out->message(_func, out->Error, "%s %p: %s",
				             MPT_tr("node"), head, MPT_tr("bad element name"));
			}
			return false;
		}
		// set property
		if (obj) {
			if (!grp) {
				if (obj->set_property(name, from) >= 0) {
					continue;
				}
			}
			if (from) {
				value val;
				
				if (from->get(val)) {
					if (obj->set(name, val, out)) {
						continue;
					}
				}
				obj->set(name, from->string(), out);
				continue;
			}
		}
		if (!grp) {
			continue;
		}
		// get item type
		const char *start, *pos;
		size_t len;
		start = pos = name;
		name = mpt_convert_key(&pos, 0, &len);
		if (!name || name != start || !*name) {
			if (out) {
				out->message(_func, out->Warning, "%s: %s",
				             MPT_tr("bad element name"), start);
			}
			continue;
		}
		// create item
		if (!(from = grp->create(name, len))) {
			if (out) {
				out->message(_func, out->Warning, "%s: %s",
				             MPT_tr("invalid item type"), std::string(name, len).c_str());
			}
			continue;
		}
		// get item name
		name = mpt_convert_key(&pos, ":", &len);
		
		if (!name || !len) {
			if (out) {
				out->message(_func, out->Warning, "%s",
				             MPT_tr("empty item name"));
			}
			from->unref();
			continue;
		}
		// name conflict on same level
		if (collection::relation(*grp).find(from->type(), name, len)) {
			if (out) {
				out->message(_func, out->Warning, "%s: %s",
				             MPT_tr("conflicting item name"), std::string(name, len).c_str());
			}
			from->unref();
			continue;
		}
		const char *ident = name;
		int ilen = len;
		
		// find dependant items
		while ((name = mpt_convert_key(&pos, 0, &len))) {
			convertable *curr;
			if (relation) {
				curr = relation->find(from->type(), name, len);
			} else {
				curr = collection::relation(*grp).find(from->type(), name, len);
			}
			if (!curr) {
				if (out) {
					out->message(_func, out->Error, "%s: '%s': %s",
					             MPT_tr("unable to get parent"), head->ident.name(), std::string(name, len).c_str());
				}
				from->unref();
				return false;
			}
			object *obj, *src;
			if ((src = *curr) && (obj = *from)) {
				obj->set(*src, out);
				continue;
			}
			from->unref();
			if (out) {
				out->message(_func, out->Error, "%s: '%s': %s",
				             MPT_tr("unable to get inheritance"), head->ident.name(), std::string(name, len).c_str());
			}
			return false;
		}
		// add item to group
		identifier id;
		if (!id.set_name(ident, ilen)) {
			if (out) {
				out->message(_func, out->Error, "%s: %s",
				             MPT_tr("unable add item"), std::string(ident, ilen).c_str());
			}
			continue;
		}
		if (grp->append(&id, from) < 0) {
			from->unref();
			if (out) {
				out->message(_func, out->Error, "%s: %s",
				             MPT_tr("unable add item"), std::string(ident, ilen).c_str());
			}
			continue;
		}
		// set properties and subitems
		if (!head->children) {
			continue;
		}
		// process child items
		object *curr;
		if (!(curr = *from)) {
			if (out) {
				out->message(_func, out->Warning, "%s (%p): %s",
				             name, from, MPT_tr("element not an object"));
			}
		}
		group *ig;
		if (!relation || !(ig = *from)) {
			if (!(add_items(*from, head->children, 0, out))) {
				return false;
			}
			continue;
		}
		collection::relation rel(*ig, relation);
		if (!(add_items(*from, head->children, &rel, out))) {
			return false;
		}
	}
	return true;
}